

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

double __thiscall IR::IRBuilder::exp(IRBuilder *this,double __x)

{
  bool bVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  Expr *local_18;
  _Fwd_list_node_base *local_10;
  
  bVar1 = BasicBlock::isTerminated(this->block_);
  dVar2 = extraout_XMM0_Qa;
  if (!bVar1) {
    std::forward_list<IR::Exp,std::allocator<IR::Exp>>::emplace_front<IR::Expr_const*&>
              ((forward_list<IR::Exp,std::allocator<IR::Exp>> *)&this->function_->exps_,&local_18);
    local_10 = (this->function_->exps_).super__Fwd_list_base<IR::Exp,_std::allocator<IR::Exp>_>.
               _M_impl._M_head._M_next + 1;
    std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
              ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_10);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void IRBuilder::exp(const Expr* expr) {
  if (block_->isTerminated()) return;
  function_->exps_.emplace_front(expr);
  block_->push_back(&function_->exps_.front());
}